

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usda::USDAReader::Impl::ReconstructPrim<tinyusdz::Xform>
          (Impl *this,Specifier *spec,PropertyMap *properties,ReferenceList *references,Xform *xform
          )

{
  bool bVar1;
  ostream *poVar2;
  string err;
  ostringstream ss_e;
  string local_1d8 [2];
  PrimReconstructOptions local_198 [376];
  
  local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
  local_1d8[0]._M_string_length = 0;
  local_1d8[0].field_2._M_local_buf[0] = '\0';
  local_198[0].strict_allowedToken_check = false;
  bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
                    (spec,properties,references,xform,&this->_warn,local_1d8,local_198);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrim");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x61e);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_198,"Failed to reconstruct Xform Prim: ");
    poVar2 = ::std::operator<<(poVar2,(string *)local_1d8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool USDAReader::Impl::ReconstructPrim(
    const Specifier &spec,
    const prim::PropertyMap &properties,
    const prim::ReferenceList &references,
    Xform *xform) {

  std::string err;
  if (!prim::ReconstructPrim(spec, properties, references, xform, &_warn, &err)) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Xform Prim: " << err);
  }
  return true;
}